

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_options.c
# Opt level: O0

int archive_set_filter_option(archive *_a,char *m,char *o,char *v)

{
  int iVar1;
  int local_48;
  int rv;
  int r;
  archive_write_filter *filter;
  archive_write *a;
  char *v_local;
  char *o_local;
  char *m_local;
  archive *_a_local;
  
  local_48 = -0x14;
  _rv = _a[1].error_string.buffer_length;
  do {
    if (_rv == 0) {
      if ((local_48 == -0x14) && (m != (char *)0x0)) {
        local_48 = -0x15;
      }
      return local_48;
    }
    if ((*(long *)(_rv + 0x18) != 0) &&
       ((m == (char *)0x0 || (iVar1 = strcmp(*(char **)(_rv + 0x48),m), iVar1 == 0)))) {
      iVar1 = (**(code **)(_rv + 0x18))(_rv,o,v);
      if (iVar1 == -0x1e) {
        return -0x1e;
      }
      if (m != (char *)0x0) {
        return iVar1;
      }
      if (iVar1 == 0) {
        local_48 = 0;
      }
    }
    _rv = *(size_t *)(_rv + 0x10);
  } while( true );
}

Assistant:

static int
archive_set_filter_option(struct archive *_a, const char *m, const char *o,
    const char *v)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *filter;
	int r, rv = ARCHIVE_WARN;

	for (filter = a->filter_first; filter != NULL; filter = filter->next_filter) {
		if (filter->options == NULL)
			continue;
		if (m != NULL && strcmp(filter->name, m) != 0)
			continue;

		r = filter->options(filter, o, v);

		if (r == ARCHIVE_FATAL)
			return (ARCHIVE_FATAL);

		if (m != NULL)
			return (r);

		if (r == ARCHIVE_OK)
			rv = ARCHIVE_OK;
	}
	/* If the filter name didn't match, return a special code for
	 * _archive_set_option[s]. */
	if (rv == ARCHIVE_WARN && m != NULL)
		rv = ARCHIVE_WARN - 1;
	return (rv);
}